

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpolation2d.cpp
# Opt level: O3

void save_data(vector<double,_std::allocator<double>_> *x,vector<double,_std::allocator<double>_> *y
              ,vector<double,_std::allocator<double>_> *data,string *name)

{
  _Ios_Openmode _Var1;
  pointer pdVar2;
  ostream *poVar3;
  ulong uVar4;
  ofstream file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  _Var1 = std::__cxx11::string::append((char *)name);
  std::ofstream::open((string *)&local_230,_Var1);
  pdVar2 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar2) {
    uVar4 = 0;
    do {
      poVar3 = std::ostream::_M_insert<double>(pdVar2[uVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<double>
                         ((y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<double>
                         ((data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
      pdVar2 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar2 >> 3));
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void save_data(std::vector<double> x, std::vector<double> y,
               std::vector<double> data, std::string name) {
  ofstream file;
  file.open(name.append(".dat"));
  for (int i = 0; i < x.size(); i++) {
    file << x[i] << " " << y[i] << " " << data[i] << std::endl;
  }
  file.close();
}